

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compaction_callback_test(bool multi_kv)

{
  fdb_status fVar1;
  size_t valuelen;
  byte in_DIL;
  cb_args cb_args;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status s;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char bodybuf [256];
  char keybuf [256];
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  char *value;
  int in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  byte in_stack_fffffffffffffc60;
  byte in_stack_fffffffffffffc61;
  byte in_stack_fffffffffffffc62;
  undefined5 in_stack_fffffffffffffc63;
  fdb_kvs_handle *local_278;
  char local_268 [56];
  fdb_kvs_config *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  fdb_kvs_handle **in_stack_fffffffffffffde0;
  fdb_file_handle *in_stack_fffffffffffffde8;
  fdb_config *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  fdb_file_handle **in_stack_fffffffffffffe58;
  char local_168 [260];
  int local_64;
  int local_60;
  uint local_5c;
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  byte local_1;
  
  local_1 = in_DIL & 1;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  memleak_start();
  local_64 = 1000;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  memset(&stack0xfffffffffffffc58,0,0x18);
  local_60 = system("rm -rf  compact_test* > errorlog.txt");
  fdb_open(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if ((local_1 & 1) == 0) {
    fdb_kvs_open_default
              ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               &in_stack_fffffffffffffc28->root,(fdb_kvs_config *)0x1041c7);
  }
  else {
    fdb_kvs_open(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd0);
  }
  for (local_5c = 0; (int)local_5c < local_64; local_5c = local_5c + 1) {
    sprintf(local_168,"key%04d",(ulong)local_5c);
    sprintf(local_268,"body%04d",(ulong)local_5c);
    valuelen = strlen(local_168);
    value = local_268;
    strlen(local_268);
    fVar1 = fdb_set_kv(local_278,
                       (void *)CONCAT53(in_stack_fffffffffffffc63,
                                        CONCAT12(in_stack_fffffffffffffc62,
                                                 CONCAT11(in_stack_fffffffffffffc61,
                                                          in_stack_fffffffffffffc60))),
                       CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),value,valuelen)
    ;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x91);
      compaction_callback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x91,"void compaction_callback_test(bool)");
      }
    }
  }
  fVar1 = fdb_commit(in_stack_fffffffffffffc28,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x94);
    compaction_callback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x94,"void compaction_callback_test(bool)");
    }
  }
  fVar1 = fdb_compact((fdb_file_handle *)
                      CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                      (char *)in_stack_fffffffffffffc28);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x96);
    compaction_callback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x96,"void compaction_callback_test(bool)");
    }
  }
  if (in_stack_fffffffffffffc58 != local_64) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x98);
    compaction_callback_test::__test_pass = 0;
    if (in_stack_fffffffffffffc58 != local_64) {
      __assert_fail("cb_args.n_moved_docs == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x98,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc60 & 1) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x99);
    compaction_callback_test::__test_pass = 0;
    if ((in_stack_fffffffffffffc60 & 1) == 0) {
      __assert_fail("cb_args.begin",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x99,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc61 & 1) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x9a);
    compaction_callback_test::__test_pass = 0;
    if ((in_stack_fffffffffffffc61 & 1) == 0) {
      __assert_fail("cb_args.end",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x9a,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc62 & 1) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x9b);
    compaction_callback_test::__test_pass = 0;
    if ((in_stack_fffffffffffffc62 & 1) == 0) {
      __assert_fail("cb_args.wal_flush",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x9b,"void compaction_callback_test(bool)");
    }
  }
  fdb_close(in_stack_fffffffffffffc28);
  memset(&stack0xfffffffffffffc58,0,0x18);
  fdb_open(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if ((local_1 & 1) == 0) {
    fdb_kvs_open_default
              ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               &in_stack_fffffffffffffc28->root,(fdb_kvs_config *)0x10461f);
  }
  else {
    fdb_kvs_open(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd0);
  }
  fVar1 = fdb_compact((fdb_file_handle *)
                      CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                      (char *)in_stack_fffffffffffffc28);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xac);
    compaction_callback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xac,"void compaction_callback_test(bool)");
    }
  }
  if (in_stack_fffffffffffffc58 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xad);
    compaction_callback_test::__test_pass = 0;
    if (in_stack_fffffffffffffc58 != 0) {
      __assert_fail("cb_args.n_moved_docs == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xad,"void compaction_callback_test(bool)");
    }
    in_stack_fffffffffffffc58 = 0;
  }
  if ((in_stack_fffffffffffffc60 & 1) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xae);
    compaction_callback_test::__test_pass = 0;
    if ((in_stack_fffffffffffffc60 & 1) == 0) {
      __assert_fail("cb_args.begin",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xae,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc61 & 1) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xaf);
    compaction_callback_test::__test_pass = 0;
    if ((in_stack_fffffffffffffc61 & 1) == 0) {
      __assert_fail("cb_args.end",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xaf,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc62 & 1) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb0);
    compaction_callback_test::__test_pass = 0;
    if ((in_stack_fffffffffffffc62 & 1) == 0) {
      __assert_fail("cb_args.wal_flush",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb0,"void compaction_callback_test(bool)");
    }
  }
  fdb_close(in_stack_fffffffffffffc28);
  memset(&stack0xfffffffffffffc58,0,0x18);
  fdb_open(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if ((local_1 & 1) == 0) {
    fdb_kvs_open_default
              ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               &in_stack_fffffffffffffc28->root,(fdb_kvs_config *)0x1048b1);
  }
  else {
    fdb_kvs_open(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd0);
  }
  fVar1 = fdb_compact((fdb_file_handle *)
                      CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                      (char *)in_stack_fffffffffffffc28);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xc0);
    compaction_callback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xc0,"void compaction_callback_test(bool)");
    }
  }
  if (in_stack_fffffffffffffc58 != local_64) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xc1);
    compaction_callback_test::__test_pass = 0;
    if (in_stack_fffffffffffffc58 != local_64) {
      __assert_fail("cb_args.n_moved_docs == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xc1,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc60 & 1) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xc2);
    compaction_callback_test::__test_pass = 0;
    if ((in_stack_fffffffffffffc60 & 1) == 0) {
      __assert_fail("cb_args.begin",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xc2,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc61 & 1) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xc3);
    compaction_callback_test::__test_pass = 0;
    if ((in_stack_fffffffffffffc61 & 1) == 0) {
      __assert_fail("cb_args.end",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xc3,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc62 & 1) != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xc4);
    compaction_callback_test::__test_pass = 0;
    if (((in_stack_fffffffffffffc62 ^ 0xff) & 1) == 0) {
      __assert_fail("!cb_args.wal_flush",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xc4,"void compaction_callback_test(bool)");
    }
  }
  fdb_close(in_stack_fffffffffffffc28);
  memset(&stack0xfffffffffffffc58,0,0x18);
  fdb_open(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if ((local_1 & 1) == 0) {
    fdb_kvs_open_default
              ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               &in_stack_fffffffffffffc28->root,(fdb_kvs_config *)0x104b54);
  }
  else {
    fdb_kvs_open(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd0);
  }
  fVar1 = fdb_compact((fdb_file_handle *)
                      CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                      (char *)in_stack_fffffffffffffc28);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd3);
    compaction_callback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd3,"void compaction_callback_test(bool)");
    }
  }
  if (in_stack_fffffffffffffc58 != local_64) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd4);
    compaction_callback_test::__test_pass = 0;
    if (in_stack_fffffffffffffc58 != local_64) {
      __assert_fail("cb_args.n_moved_docs == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd4,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc60 & 1) != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd5);
    compaction_callback_test::__test_pass = 0;
    if (((in_stack_fffffffffffffc60 ^ 0xff) & 1) == 0) {
      __assert_fail("!cb_args.begin",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd5,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc61 & 1) != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd6);
    compaction_callback_test::__test_pass = 0;
    if (((in_stack_fffffffffffffc61 ^ 0xff) & 1) == 0) {
      __assert_fail("!cb_args.end",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd6,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc62 & 1) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xd7);
    compaction_callback_test::__test_pass = 0;
    if ((in_stack_fffffffffffffc62 & 1) == 0) {
      __assert_fail("cb_args.wal_flush",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xd7,"void compaction_callback_test(bool)");
    }
  }
  fdb_close(in_stack_fffffffffffffc28);
  memset(&stack0xfffffffffffffc58,0,0x18);
  fdb_open(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if ((local_1 & 1) == 0) {
    fdb_kvs_open_default
              ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               &in_stack_fffffffffffffc28->root,(fdb_kvs_config *)0x104dfc);
  }
  else {
    fdb_kvs_open(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd0);
  }
  fVar1 = fdb_compact((fdb_file_handle *)
                      CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                      (char *)in_stack_fffffffffffffc28);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xe5);
    compaction_callback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xe5,"void compaction_callback_test(bool)");
    }
  }
  if (in_stack_fffffffffffffc58 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xe6);
    compaction_callback_test::__test_pass = 0;
    if (in_stack_fffffffffffffc58 != 0) {
      __assert_fail("cb_args.n_moved_docs == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xe6,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc5c == 0) || (local_64 < in_stack_fffffffffffffc5c)) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xe7);
    compaction_callback_test::__test_pass = 0;
    if (in_stack_fffffffffffffc5c == 0 || local_64 < in_stack_fffffffffffffc5c) {
      __assert_fail("cb_args.n_batch_move && cb_args.n_batch_move <= n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xe7,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc60 & 1) != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xe8);
    compaction_callback_test::__test_pass = 0;
    if (((in_stack_fffffffffffffc60 ^ 0xff) & 1) == 0) {
      __assert_fail("!cb_args.begin",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xe8,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc61 & 1) != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xe9);
    compaction_callback_test::__test_pass = 0;
    if (((in_stack_fffffffffffffc61 ^ 0xff) & 1) == 0) {
      __assert_fail("!cb_args.end",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xe9,"void compaction_callback_test(bool)");
    }
  }
  if ((in_stack_fffffffffffffc62 & 1) != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xea);
    compaction_callback_test::__test_pass = 0;
    if (((in_stack_fffffffffffffc62 ^ 0xff) & 1) == 0) {
      __assert_fail("!cb_args.wal_flush",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xea,"void compaction_callback_test(bool)");
    }
  }
  fdb_close(in_stack_fffffffffffffc28);
  fdb_shutdown();
  memleak_end();
  if ((local_1 & 1) == 0) {
    if (compaction_callback_test::__test_pass == 0) {
      fprintf(_stderr,"%s FAILED\n","compaction callback function single kv mode test");
    }
    else {
      fprintf(_stderr,"%s PASSED\n","compaction callback function single kv mode test");
    }
  }
  else if (compaction_callback_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","compaction callback function multi kv mode test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","compaction callback function multi kv mode test");
  }
  return;
}

Assistant:

void compaction_callback_test(bool multi_kv)
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = compaction_cb;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;
    fconfig.multi_kv_instances = multi_kv;

    // remove all previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;

    // write docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        sprintf(bodybuf, "body%04d", i);
        s = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_compact(dbfile, "./compact_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without move doc
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;
    fdb_open(&dbfile, "./compact_test2", &fconfig);

    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test3");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == 0);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without wal_flush
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_END;
    fdb_open(&dbfile, "./compact_test3", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test4");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(!cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without begin/end
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL;
    fdb_open(&dbfile, "./compact_test4", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test5");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(!cb_args.begin);
    TEST_CHK(!cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db with batch move
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BATCH_MOVE;
    fdb_open(&dbfile, "./compact_test5", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test6");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == 0);
    TEST_CHK(cb_args.n_batch_move && cb_args.n_batch_move <= n);
    TEST_CHK(!cb_args.begin);
    TEST_CHK(!cb_args.end);
    TEST_CHK(!cb_args.wal_flush);
    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();
    if (multi_kv) {
        TEST_RESULT("compaction callback function multi kv mode test");
    } else {
        TEST_RESULT("compaction callback function single kv mode test");
    }
}